

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable_fwd.hpp
# Opt level: O3

void __thiscall boost::condition_variable::condition_variable(condition_variable *this)

{
  int iVar1;
  int iVar2;
  thread_resource_error local_50;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    thread_resource_error::thread_resource_error
              (&local_50,iVar1,
               "boost::condition_variable::condition_variable() constructor failed in pthread_mutex_init"
              );
    throw_exception<boost::thread_resource_error>(&local_50);
  }
  iVar1 = pthread_cond_init((pthread_cond_t *)&this->cond,(pthread_condattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  iVar2 = pthread_mutex_destroy((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    thread_resource_error::thread_resource_error
              (&local_50,iVar1,
               "boost::condition_variable::condition_variable() constructor failed in detail::monotonic_pthread_cond_init"
              );
    throw_exception<boost::thread_resource_error>(&local_50);
  }
  __assert_fail("!pthread_mutex_destroy(&internal_mutex)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/condition_variable_fwd.hpp"
                ,0x65,"boost::condition_variable::condition_variable()");
}

Assistant:

condition_variable()
        {
            int res;
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            // Even if it is not used, the internal_mutex exists (see
            // above) and must be initialized (etc) in case some
            // compilation units provide interruptions and others
            // don't.
            res=pthread_mutex_init(&internal_mutex,NULL);
            if(res)
            {
                boost::throw_exception(thread_resource_error(res, "boost::condition_variable::condition_variable() constructor failed in pthread_mutex_init"));
            }
//#endif
            res = detail::monotonic_pthread_cond_init(cond);
            if (res)
            {
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                // ditto
                BOOST_VERIFY(!pthread_mutex_destroy(&internal_mutex));
//#endif
                boost::throw_exception(thread_resource_error(res, "boost::condition_variable::condition_variable() constructor failed in detail::monotonic_pthread_cond_init"));
            }
        }